

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::diveTable
          (AVisitor<hiberlite::ExtractModel> *this,string *name)

{
  string local_38 [32];
  string *local_18;
  string *name_local;
  AVisitor<hiberlite::ExtractModel> *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)name);
  pushAndSubTable(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void AVisitor<Vis>::diveTable(std::string name){
	pushAndSubTable(name);
}